

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

size_t EmitArgs(ParseNode *pnode,BOOL fAssignRegs,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,ProfileId callSiteId,bool emitProfiledArgouts,
               AuxArray<unsigned_int> *spreadIndices)

{
  ParseNodeBin *pPVar1;
  size_t sVar2;
  ArgSlot local_34 [4];
  ArgSlot argIndex;
  ArgSlot spreadIndex;
  
  local_34[0] = 0;
  local_34[1] = 0;
  if (pnode == (ParseNode *)0x0) {
    sVar2 = 0;
  }
  else {
    while (pnode->nop == knopList) {
      pPVar1 = ParseNode::AsParseNodeBin(pnode);
      EmitOneArg(pPVar1->pnode1,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,local_34,
                 local_34 + 1,0xffffffff,emitProfiledArgouts,spreadIndices);
      pPVar1 = ParseNode::AsParseNodeBin(pnode);
      pnode = pPVar1->pnode2;
    }
    EmitOneArg(pnode,fAssignRegs,byteCodeGenerator,funcInfo,callSiteId,local_34,local_34 + 1,
               0xffffffff,emitProfiledArgouts,spreadIndices);
    sVar2 = (size_t)local_34[0];
  }
  return sVar2;
}

Assistant:

size_t EmitArgs(
    ParseNode *pnode,
    BOOL fAssignRegs,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    bool emitProfiledArgouts,
    Js::AuxArray<uint32> *spreadIndices = nullptr
    )
{
    Js::ArgSlot argIndex = 0;
    Js::ArgSlot spreadIndex = 0;

    if (pnode != nullptr)
    {
        while (pnode->nop == knopList)
        {
            EmitOneArg(pnode->AsParseNodeBin()->pnode1, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, Js::Constants::NoRegister, emitProfiledArgouts, spreadIndices);
            pnode = pnode->AsParseNodeBin()->pnode2;
        }

        EmitOneArg(pnode, fAssignRegs, byteCodeGenerator, funcInfo, callSiteId, argIndex, spreadIndex, Js::Constants::NoRegister, emitProfiledArgouts, spreadIndices);
    }

    return argIndex;
}